

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O2

void mjs::anon_unknown_33::define_own_property_checked
               (gc_heap_ptr<mjs::global_object> *global,object_ptr *o,string *p,value *desc)

{
  property_attribute pVar1;
  property_attribute attr;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  value *pvVar6;
  long *plVar7;
  undefined8 *puVar8;
  object *poVar9;
  void *pvVar10;
  wostream *pwVar11;
  native_error_exception *pnVar12;
  global_object *pgVar13;
  wchar_t *pwVar14;
  wstring_view wVar15;
  wstring_view p_00;
  wstring_view p_01;
  wstring_view p_02;
  wstring_view p_03;
  wstring_view p_04;
  wstring_view p_05;
  wstring_view p_06;
  wstring_view p_07;
  wstring_view name;
  property_attribute current_attributes;
  undefined1 local_268 [24];
  anon_class_16_2_d5e5c5aa check_accessor;
  value set;
  undefined1 local_218 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_210;
  gc_heap_ptr_untyped *local_1f0;
  property_attribute a;
  anon_class_24_3_a4a98722 apply_flag;
  wostringstream woss;
  wchar_t *local_1a0 [46];
  
  local_268._16_8_ = p;
  local_1f0 = &global->super_gc_heap_ptr_untyped;
  pvVar6 = (value *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::validate_object((global_object *)local_268,pvVar6);
  plVar7 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  _woss = string::view((string *)local_268._16_8_);
  current_attributes = (**(code **)(*plVar7 + 0x30))(plVar7);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
  set.type_ = 8;
  set._4_4_ = 0;
  set.field_1.n_ = (double)anon_var_dwarf_13f57f;
  (**(code **)*puVar8)(&woss,puVar8);
  bVar2 = to_boolean((value *)&woss);
  value::~value((value *)&woss);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
  set.type_ = 10;
  set._4_4_ = 0;
  set.field_1.n_ = (double)anon_var_dwarf_13f5c9;
  (**(code **)*puVar8)(&woss,puVar8);
  bVar3 = to_boolean((value *)&woss);
  value::~value((value *)&woss);
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
  pvVar6 = &set;
  set.type_ = 0xc;
  set._4_4_ = 0;
  set.field_1.n_ = (double)anon_var_dwarf_13f5d3;
  (**(code **)*puVar8)(&woss,puVar8,pvVar6);
  bVar4 = to_boolean((value *)&woss);
  pVar1 = !bVar2 + dont_enum;
  if (bVar3) {
    pVar1 = (uint)!bVar2;
  }
  value::~value((value *)&woss);
  attr = pVar1 + dont_delete;
  if (bVar4) {
    attr = pVar1;
  }
  poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
  local_1a0[0] = L"get";
  _woss = (pointer)0x3;
  bVar2 = object::has_property(poVar9,(wstring_view *)&woss);
  if (bVar2) {
LAB_001490cc:
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
    pwVar14 = L"value";
    local_210.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)L"value";
    local_218 = (undefined1  [8])0x5;
    bVar2 = object::has_property(poVar9,(wstring_view *)local_218);
    if (bVar2) {
LAB_00149a82:
      pnVar12 = (native_error_exception *)__cxa_allocate_exception(0x58);
      pgVar13 = (global_object *)gc_heap_ptr_untyped::get(local_1f0);
      global_object::stack_trace_abi_cxx11_((wstring *)&woss,pgVar13);
      set._0_8_ = local_1a0[0];
      set.field_1.n_ = (double)_woss;
      local_210.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)"Accessor property descriptor may not have value or writable attributes";
      local_218 = (undefined1  [8])0x46;
      native_error_exception::native_error_exception
                (pnVar12,type,(wstring_view *)&set,(string_view *)local_218);
      __cxa_throw(pnVar12,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
    apply_flag.desc = (object_ptr *)0x8;
    apply_flag.a = (property_attribute *)anon_var_dwarf_13f57f;
    bVar2 = object::has_property(poVar9,(wstring_view *)&apply_flag);
    if (bVar2) goto LAB_00149a82;
  }
  else {
    poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
    set.type_ = number;
    set._4_4_ = 0;
    pwVar14 = L"set";
    set.field_1.n_ = (double)anon_var_dwarf_12055b;
    bVar2 = object::has_property(poVar9,(wstring_view *)&set);
    if (bVar2) goto LAB_001490cc;
  }
  bVar2 = is_valid(current_attributes);
  if (bVar2) {
    wVar15._M_str = pwVar14;
    wVar15._M_len = (size_t)L"writable";
    bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0x8,wVar15);
    if (((((bVar2) ||
          (p_00._M_str = pwVar14, p_00._M_len = (size_t)L"enumerable",
          bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0xa,p_00), bVar2)) ||
         (p_01._M_str = pwVar14, p_01._M_len = (size_t)L"configurable",
         bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0xc,p_01), bVar2)) ||
        ((p_02._M_str = pwVar14, p_02._M_len = (size_t)L"value",
         bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0x5,p_02), bVar2 ||
         (p_03._M_str = pwVar14, p_03._M_len = (size_t)L"get",
         bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0x3,p_03), bVar2)))) ||
       (p_04._M_str = pwVar14, p_04._M_len = (size_t)L"set",
       bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0x3,p_04), bVar2)) {
      if (current_attributes == attr) {
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
        _local_218 = (_Any_data)string::view((string *)local_268._16_8_);
        (**(code **)*puVar8)(&woss,puVar8,local_218);
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
        apply_flag.desc = (object_ptr *)0x5;
        apply_flag.a = (property_attribute *)anon_var_dwarf_13f569;
        pwVar14 = (wchar_t *)*puVar8;
        (**(code **)pwVar14)(&set,puVar8);
        bVar2 = operator==((value *)&woss,&set);
        value::~value(&set);
        value::~value((value *)&woss);
        if (bVar2) goto LAB_00149747;
      }
      bVar2 = has_attributes(current_attributes,dont_delete);
      bVar5 = 1;
      if (bVar2) {
        bVar2 = has_attributes(attr,dont_delete);
        if (!bVar2) goto LAB_00149a5d;
        p_05._M_str = pwVar14;
        p_05._M_len = (size_t)L"enumerable";
        bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0xa,p_05);
        if (bVar2) {
          bVar2 = has_attributes(current_attributes,dont_enum);
          bVar3 = has_attributes(attr,dont_enum);
          if (bVar2 != bVar3) goto LAB_00149a5d;
        }
      }
      bVar2 = is_generic_descriptor((object_ptr *)local_268);
      if (!bVar2) {
        bVar2 = has_attributes(current_attributes,accessor);
        bVar3 = is_data_descriptor((object_ptr *)local_268);
        if (bVar2 == bVar3) {
          bVar2 = has_attributes(current_attributes,dont_delete);
          if (bVar2) goto LAB_00149a5d;
        }
        else {
          bVar2 = has_attributes(current_attributes,accessor);
          if (bVar2) {
            bVar2 = has_attributes(current_attributes,accessor);
            if ((!bVar2) || (bVar2 = is_accessor_descriptor((object_ptr *)local_268), !bVar2)) {
              __assert_fail("has_attributes(current_attributes, property_attribute::accessor) && is_accessor_descriptor(desc)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                            ,0xae,
                            "define_own_property_result mjs::(anonymous namespace)::define_own_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const object_ptr &)"
                           );
            }
          }
          else {
            bVar2 = has_attributes(current_attributes,dont_delete);
            if ((bVar2) && (bVar2 = has_attributes(current_attributes,read_only), bVar2)) {
              bVar5 = 1;
              bVar2 = has_attributes(attr,read_only);
              if (!bVar2) goto LAB_00149a5d;
              p_07._M_str = pwVar14;
              p_07._M_len = (size_t)L"value";
              bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0x5,p_07);
              if (bVar2) {
                puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
                _local_218 = (_Any_data)string::view((string *)local_268._16_8_);
                (**(code **)*puVar8)(&woss,puVar8,local_218);
                puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
                apply_flag.desc = (object_ptr *)0x5;
                apply_flag.a = (property_attribute *)anon_var_dwarf_13f569;
                pwVar14 = (wchar_t *)*puVar8;
                (**(code **)pwVar14)(&set,puVar8);
                bVar2 = operator!=((value *)&woss,&set);
                value::~value(&set);
                value::~value((value *)&woss);
                if (bVar2) goto LAB_00149a5d;
              }
            }
          }
        }
      }
      apply_flag.a = &a;
      a = none;
      apply_flag.current_attributes = &current_attributes;
      apply_flag.desc = (object_ptr *)local_268;
      define_own_property::anon_class_24_3_a4a98722::operator()(&apply_flag,L"enumerable",dont_enum)
      ;
      define_own_property::anon_class_24_3_a4a98722::operator()
                (&apply_flag,L"configurable",dont_delete);
      bVar2 = is_accessor_descriptor((object_ptr *)local_268);
      if ((!bVar2) &&
         ((bVar2 = is_generic_descriptor((object_ptr *)local_268), !bVar2 ||
          (bVar2 = has_attributes(current_attributes,accessor), !bVar2)))) {
        define_own_property::anon_class_24_3_a4a98722::operator()(&apply_flag,L"writable",read_only)
        ;
        plVar7 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
        p_06._M_str = pwVar14;
        p_06._M_len = (size_t)L"value";
        bVar2 = has_own_property((anon_unknown_33 *)local_268,(object_ptr *)0x5,p_06);
        if (bVar2) {
          puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
          set.type_ = object;
          set._4_4_ = 0;
          set.field_1.n_ = (double)anon_var_dwarf_13f569;
        }
        else {
          puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
          _local_218 = (_Any_data)string::view((string *)local_268._16_8_);
          pvVar6 = (value *)local_218;
        }
        (**(code **)*puVar8)(&woss,puVar8,pvVar6);
        bVar5 = (**(code **)(*plVar7 + 0x28))(plVar7,local_268._16_8_,&woss,a);
        value::~value((value *)&woss);
        bVar5 = bVar5 ^ 1;
        goto LAB_00149a5d;
      }
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
      set.type_ = number;
      set._4_4_ = 0;
      set.field_1.n_ = (double)anon_var_dwarf_12053c;
      (**(code **)*puVar8)(&woss,puVar8);
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
      local_210.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)L"set";
      local_218 = (undefined1  [8])0x3;
      (**(code **)*puVar8)(&set,puVar8);
      bVar2 = has_attributes(current_attributes,accessor);
      if (bVar2) {
        pvVar10 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
        wVar15 = string::view((string *)local_268._16_8_);
        name._M_str = (wchar_t *)wVar15._M_len;
        name._M_len = (size_t)pvVar10;
        object::get_accessor_property_object((object *)&check_accessor,name);
        poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
        local_210.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)L"get";
        local_218 = (undefined1  [8])0x3;
        bVar2 = object::has_property(poVar9,(wstring_view *)local_218);
        if (!bVar2) {
          poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&check_accessor);
          local_210.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)L"get";
          local_218 = (undefined1  [8])0x3;
          bVar2 = object::has_property(poVar9,(wstring_view *)local_218);
          if (bVar2) {
            puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&check_accessor);
            (**(code **)*puVar8)(local_218,puVar8);
            value::operator=((value *)&woss,(value *)local_218);
            value::~value((value *)local_218);
          }
LAB_00149837:
          if (set.type_ == undefined) {
            poVar9 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&check_accessor);
            local_210.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                 (gc_heap *)L"set";
            local_218 = (undefined1  [8])0x3;
            bVar2 = object::has_property(poVar9,(wstring_view *)local_218);
            if (bVar2) {
              puVar8 = (undefined8 *)
                       gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&check_accessor);
              (**(code **)*puVar8)(local_218,puVar8);
              value::operator=(&set,(value *)local_218);
              value::~value((value *)local_218);
            }
          }
          else {
            bVar2 = has_attributes(current_attributes,read_only);
            if (bVar2) {
              puVar8 = (undefined8 *)
                       gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&check_accessor);
              (**(code **)*puVar8)(local_218,puVar8);
              bVar2 = operator!=(&set,(value *)local_218);
              value::~value((value *)local_218);
              if (bVar2) goto LAB_001498a3;
            }
          }
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&check_accessor);
          goto LAB_00149a19;
        }
        bVar2 = has_attributes(current_attributes,read_only);
        if (!bVar2) goto LAB_00149837;
        puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&check_accessor);
        (**(code **)*puVar8)(local_218,puVar8);
        bVar2 = operator!=((value *)&woss,(value *)local_218);
        value::~value((value *)local_218);
        if (!bVar2) goto LAB_00149837;
LAB_001498a3:
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&check_accessor);
        bVar5 = 1;
      }
      else {
LAB_00149a19:
        bVar5 = 0;
        define_accessor_property
                  ((gc_heap_ptr<mjs::global_object> *)local_1f0,o,(string *)local_268._16_8_,
                   (value *)&woss,&set,a);
      }
      value::~value(&set);
      value::~value((value *)&woss);
      goto LAB_00149a5d;
    }
  }
  else {
    pvVar10 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    if (*(char *)((long)pvVar10 + 0x1c) != '\x01') {
      bVar5 = 2;
      goto LAB_00149a5d;
    }
    bVar2 = is_generic_descriptor((object_ptr *)local_268);
    if ((bVar2) || (bVar2 = is_data_descriptor((object_ptr *)local_268), bVar2)) {
      plVar7 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
      set.type_ = object;
      set._4_4_ = 0;
      set.field_1.n_ = (double)anon_var_dwarf_13f569;
      (**(code **)*puVar8)(&woss,puVar8);
      (**(code **)(*plVar7 + 8))(plVar7,local_268._16_8_,&woss,attr);
    }
    else {
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
      set.type_ = number;
      set._4_4_ = 0;
      set.field_1.n_ = (double)anon_var_dwarf_12053c;
      (**(code **)*puVar8)(&woss,puVar8);
      puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_268);
      local_210.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)L"set";
      local_218 = (undefined1  [8])0x3;
      (**(code **)*puVar8)(&set,puVar8);
      if (set.type_ == undefined && _woss == undefined) {
        __assert_fail("get.type() != value_type::undefined || set.type() != value_type::undefined",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                      ,0x6e,
                      "define_own_property_result mjs::(anonymous namespace)::define_own_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const object_ptr &)"
                     );
      }
      check_accessor.p = (string *)local_268._16_8_;
      check_accessor.global = (gc_heap_ptr<mjs::global_object> *)local_1f0;
      value::value((value *)local_218,(value *)&woss);
      define_own_property::anon_class_16_2_d5e5c5aa::operator()
                (&check_accessor,"Getter",(value *)local_218);
      value::~value((value *)local_218);
      value::value((value *)&apply_flag,&set);
      define_own_property::anon_class_16_2_d5e5c5aa::operator()
                (&check_accessor,"Setter",(value *)&apply_flag);
      value::~value((value *)&apply_flag);
      define_accessor_property
                ((gc_heap_ptr<mjs::global_object> *)local_1f0,o,(string *)local_268._16_8_,
                 (value *)&woss,&set,attr);
      value::~value(&set);
    }
    value::~value((value *)&woss);
  }
LAB_00149747:
  bVar5 = 0;
LAB_00149a5d:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_268);
  if (bVar5 != 0) {
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
    if (bVar5 == 1) {
      pwVar11 = std::operator<<((wostream *)&woss,"cannot redefine property: ");
      wVar15 = string::view((string *)local_268._16_8_);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar11,wVar15._M_str,wVar15._M_len);
    }
    else {
      pwVar11 = std::operator<<((wostream *)&woss,"cannot define property: ");
      wVar15 = string::view((string *)local_268._16_8_);
      pwVar11 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                          (pwVar11,wVar15._M_str,wVar15._M_len);
      std::operator<<(pwVar11,", object is not extensible");
    }
    pnVar12 = (native_error_exception *)__cxa_allocate_exception(0x58);
    pgVar13 = (global_object *)gc_heap_ptr_untyped::get(local_1f0);
    global_object::stack_trace_abi_cxx11_((wstring *)&set,pgVar13);
    apply_flag.desc =
         (object_ptr *)
         set.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    apply_flag.a = (property_attribute *)set._0_8_;
    std::__cxx11::wstringbuf::str();
    check_accessor.p =
         (string *)local_210.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    check_accessor.global = (gc_heap_ptr<mjs::global_object> *)local_218;
    native_error_exception::native_error_exception
              (pnVar12,type,(wstring_view *)&apply_flag,(wstring_view *)&check_accessor);
    __cxa_throw(pnVar12,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  return;
}

Assistant:

void define_own_property_checked(const gc_heap_ptr<global_object>& global, const object_ptr& o, const string& p, const value& desc) {
    const auto res = define_own_property(global, o, p, global->validate_object(desc));
    if (res == define_own_property_result::ok) {
        return;
    }

    std::wostringstream woss;
    if (res == define_own_property_result::cannot_redefine) {
        woss << "cannot redefine property: " << p.view();
    } else {
        assert(res == define_own_property_result::not_extensible);
        woss << "cannot define property: " << p.view() << ", object is not extensible";
    }
    throw native_error_exception{native_error_type::type, global->stack_trace(), woss.str()};
}